

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool GetLineIsoCoordinates(ON_Line *line,ON_3dPoint P,ON_3dPoint *C)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = -(ulong)((line->to).x == (line->from).x);
  uVar3 = -(ulong)((line->to).y == (line->from).y);
  C->x = (double)(uVar2 & (ulong)P.x | ~uVar2 & 0xffe5f8bd9e331dd2);
  C->y = (double)(uVar3 & (ulong)P.y | ~uVar3 & 0xffe5f8bd9e331dd2);
  uVar2 = -(ulong)((line->to).z == (line->from).z);
  C->z = (double)(~uVar2 & 0xffe5f8bd9e331dd2 | (ulong)P.z & uVar2);
  bVar1 = ON_3dPoint::operator!=(&ON_3dPoint::UnsetPoint,C);
  return bVar1;
}

Assistant:

static bool GetLineIsoCoordinates( const ON_Line& line, const ON_3dPoint P, ON_3dPoint& C )
{
  C.x = (line.from.x == line.to.x) ? P.x : ON_UNSET_VALUE;
  C.y = (line.from.y == line.to.y) ? P.y : ON_UNSET_VALUE;
  C.z = (line.from.z == line.to.z) ? P.z : ON_UNSET_VALUE;
  return ( ON_3dPoint::UnsetPoint != C );
}